

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall SchnorrSig_GetNonce_Test::TestBody(SchnorrSig_GetNonce_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  ByteData local_a8;
  string local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey sig_nonce;
  allocator local_31;
  undefined1 local_30 [8];
  string expected_nonce;
  SchnorrSig_GetNonce_Test *this_local;
  
  expected_nonce.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,"6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::SchnorrSignature::GetNonce((SchnorrPubkey *)&gtest_ar.message_,&::signature);
  cfd::core::SchnorrPubkey::GetData(&local_a8,(SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_90,&local_a8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_70,"expected_nonce","sig_nonce.GetData().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_90
            );
  std::__cxx11::string::~string((string *)&local_90);
  cfd::core::ByteData::~ByteData(&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x4a,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(SchnorrSig, GetNonce) {
  std::string expected_nonce =
      "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee";

  auto sig_nonce = signature.GetNonce();

  EXPECT_EQ(expected_nonce, sig_nonce.GetData().GetHex());
}